

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O3

DescriptorFlags __thiscall
Js::CrossSiteObject<Js::JavascriptBooleanObject>::GetSetter
          (CrossSiteObject<Js::JavascriptBooleanObject> *this,JavascriptString *propertyNameString,
          Var *setterValue,PropertyValueInfo *info,ScriptContext *requestContext)

{
  DescriptorFlags DVar1;
  Var pvVar2;
  
  DVar1 = DynamicObject::GetSetter
                    ((DynamicObject *)this,propertyNameString,setterValue,info,requestContext);
  if (((DVar1 & Accessor) != None) && (pvVar2 = *setterValue, pvVar2 != (Var)0x0)) {
    if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = (RecyclableObject *)this;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
      pvVar2 = *setterValue;
    }
    pvVar2 = CrossSite::MarshalVar(requestContext,pvVar2,false);
    *setterValue = pvVar2;
  }
  return DVar1;
}

Assistant:

DescriptorFlags CrossSiteObject<T>::GetSetter(JavascriptString* propertyNameString, Var* setterValue, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        DescriptorFlags flags = __super::GetSetter(propertyNameString, setterValue, info, requestContext);
        if ((flags & Accessor) == Accessor && *setterValue)
        {
            PropertyValueInfo::SetNoCache(info, this);
            *setterValue = CrossSite::MarshalVar(requestContext, *setterValue);
        }
        return flags;
    }